

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void http_server_reset(http_server_t *server)

{
  http_server_t *server_local;
  
  if (server != (http_server_t *)0x0) {
    server->clients = (http_client_t *)0x0;
    server->num_clients = 0;
    server->max_clients = 0;
    server->callback = (http_client_callback_t *)0x0;
    server->fd = -1;
    return;
  }
  __assert_fail("server != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/http.c",0x23,
                "void http_server_reset(http_server_t *)");
}

Assistant:

void http_server_reset(http_server_t *server) {
  assert(server != NULL);
  
  server->clients     = NULL;
  server->num_clients = 0;
  server->max_clients = 0;
  server->callback    = NULL;
  server->fd        = -1;
}